

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void TestCollectorVector::run(void)

{
  pointer *this;
  initializer_list<int> __l;
  bool bVar1;
  socklen_t in_ECX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  sockaddr *__addr_03;
  allocator<int> local_139;
  int local_138 [6];
  iterator local_120;
  size_type local_118;
  undefined1 local_110 [8];
  vector<int,_std::allocator<int>_> reference;
  vector<int,_std::allocator<int>_> results;
  function<int_()> local_c0;
  function<int_()> local_a0;
  function<int_()> local_80;
  function<int_()> local_60;
  function<int_()> local_30;
  ProtoSignal<int_(),_Simple::CollectorVector<int>_> local_10;
  Signal<int_(),_Simple::CollectorVector<int>_> sig_vector;
  
  std::function<int_()>::function(&local_30);
  Simple::Signal<int_(),_Simple::CollectorVector<int>_>::Signal
            ((Signal<int_(),_Simple::CollectorVector<int>_> *)&local_10,&local_30);
  std::function<int_()>::~function(&local_30);
  std::function<int()>::function<int(&)(),void>((function<int()> *)&local_60,handler777);
  Simple::Lib::ProtoSignal<int_(),_Simple::CollectorVector<int>_>::connect
            (&local_10,(int)&local_60,__addr,in_ECX);
  std::function<int_()>::~function(&local_60);
  std::function<int()>::function<int(&)(),void>((function<int()> *)&local_80,handler42);
  Simple::Lib::ProtoSignal<int_(),_Simple::CollectorVector<int>_>::connect
            (&local_10,(int)&local_80,__addr_00,in_ECX);
  std::function<int_()>::~function(&local_80);
  std::function<int()>::function<int(&)(),void>((function<int()> *)&local_a0,handler1);
  Simple::Lib::ProtoSignal<int_(),_Simple::CollectorVector<int>_>::connect
            (&local_10,(int)&local_a0,__addr_01,in_ECX);
  std::function<int_()>::~function(&local_a0);
  std::function<int()>::function<int(&)(),void>((function<int()> *)&local_c0,handler42);
  Simple::Lib::ProtoSignal<int_(),_Simple::CollectorVector<int>_>::connect
            (&local_10,(int)&local_c0,__addr_02,in_ECX);
  std::function<int_()>::~function(&local_c0);
  this = &results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  std::function<int()>::function<int(&)(),void>((function<int()> *)this,handler777);
  Simple::Lib::ProtoSignal<int_(),_Simple::CollectorVector<int>_>::connect
            (&local_10,(int)this,__addr_03,in_ECX);
  std::function<int_()>::~function
            ((function<int_()> *)
             &results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  Simple::Lib::ProtoSignal<int_(),_Simple::CollectorVector<int>_>::emit
            ((CollectorResult *)
             &reference.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_10);
  local_138[0] = 0x309;
  local_138[1] = 0x2a;
  local_138[2] = 1;
  local_138[3] = 0x2a;
  local_138[4] = 0x309;
  local_120 = local_138;
  local_118 = 5;
  std::allocator<int>::allocator(&local_139);
  __l._M_len = local_118;
  __l._M_array = local_120;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_110,__l,&local_139);
  std::allocator<int>::~allocator(&local_139);
  bVar1 = std::operator==((vector<int,_std::allocator<int>_> *)
                          &reference.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                          (vector<int,_std::allocator<int>_> *)local_110);
  if (!bVar1) {
    __assert_fail("results == reference",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                  ,0x83,"static void TestCollectorVector::run()");
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_110);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &reference.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Simple::Signal<int_(),_Simple::CollectorVector<int>_>::~Signal
            ((Signal<int_(),_Simple::CollectorVector<int>_> *)&local_10);
  return;
}

Assistant:

static void
  run ()
  {
    Simple::Signal<int (), Simple::CollectorVector<int>> sig_vector;
    sig_vector.connect(handler777);
    sig_vector.connect(handler42);
    sig_vector.connect(handler1);
    sig_vector.connect(handler42);
    sig_vector.connect(handler777);
    std::vector<int> results = sig_vector.emit();
    const std::vector<int> reference = { 777, 42, 1, 42, 777, };
    assert (results == reference);
  }